

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O0

int setfillcol(int f,int n)

{
  int iVar1;
  uint uVar2;
  long lStack_48;
  int nfill;
  char *es;
  char *rep;
  char buf [32];
  int n_local;
  int f_local;
  
  iVar1 = n;
  if ((f & 7U) == 0) {
    buf._28_4_ = n;
    es = eread("Set fill-column: ",(char *)&rep,0x20,0x18);
    if (es == (char *)0x0) {
      return 2;
    }
    if (*es == '\0') {
      return 0;
    }
    uVar2 = strtonum(es,0,0x7fffffff,&stack0xffffffffffffffb8);
    if (lStack_48 != 0) {
      dobeep();
      ewprintf("Invalid fill column: %s",es);
      return 0;
    }
    fillcol = uVar2;
    ewprintf("Fill column set to %d",(ulong)uVar2);
    iVar1 = fillcol;
  }
  fillcol = iVar1;
  return 1;
}

Assistant:

int
setfillcol(int f, int n)
{
	char buf[32], *rep;
	const char *es;
	int nfill;

	if ((f & FFARG) != 0) {
		fillcol = n;
	} else {
		if ((rep = eread("Set fill-column: ", buf, sizeof(buf),
		    EFNEW | EFCR)) == NULL)
			return (ABORT);
		else if (rep[0] == '\0')
			return (FALSE);
		nfill = strtonum(rep, 0, INT_MAX, &es);
		if (es != NULL) {
			dobeep();
			ewprintf("Invalid fill column: %s", rep);
			return (FALSE);
		}
		fillcol = nfill;
		ewprintf("Fill column set to %d", fillcol);
	}
	return (TRUE);
}